

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O0

symtype lh_load_sym(soHandle_t h,char *symName)

{
  char *pcVar1;
  int iVar2;
  char *in_RSI;
  undefined8 in_RDI;
  int trip;
  size_t symLen;
  char ocbuf [257];
  char ucbuf [257];
  char lcbuf [257];
  char *err;
  char *tripSym;
  char *to;
  char *from;
  symtype s;
  int local_374;
  long local_370;
  char local_368 [272];
  char local_258 [272];
  char local_148 [264];
  long local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  symtype local_20;
  char *local_18;
  undefined8 local_10;
  
  local_20 = (symtype)0x0;
  local_40 = 0;
  local_370 = 0;
  local_374 = 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (6 < local_374) {
      return (symtype)0x0;
    }
    switch(local_374) {
    case 1:
      local_38 = local_18;
      break;
    case 2:
      local_30 = local_148;
      for (local_28 = local_18; *local_28 != '\0'; local_28 = local_28 + 1) {
        iVar2 = tolower((int)*local_28);
        *local_30 = (char)iVar2;
        local_30 = local_30 + 1;
      }
      local_370 = (long)local_28 - (long)local_18;
      pcVar1 = local_30 + 1;
      *local_30 = '_';
      local_30 = pcVar1;
      *local_30 = '\0';
      local_38 = local_148;
      break;
    case 3:
      local_30 = local_258;
      for (local_28 = local_18; *local_28 != '\0'; local_28 = local_28 + 1) {
        iVar2 = toupper((int)*local_28);
        *local_30 = (char)iVar2;
        local_30 = local_30 + 1;
      }
      pcVar1 = local_30 + 1;
      *local_30 = '_';
      local_30 = pcVar1;
      *local_30 = '\0';
      local_38 = local_258;
      break;
    case 4:
      c_strcpy(local_368,local_18);
      local_368[local_370] = '_';
      local_368[local_370 + 1] = '\0';
      local_38 = local_368;
      break;
    case 5:
      local_148[local_370] = '\0';
      local_38 = local_148;
      break;
    case 6:
      local_258[local_370] = '\0';
      local_38 = local_258;
      break;
    default:
      local_38 = local_18;
    }
    local_20 = (symtype)dlsym(local_10,local_38);
    local_40 = dlerror();
    if (local_40 == 0) break;
    printf("ERROR in %s: ","lh_load_sym");
    printf("Cannot find symbol %s in dynamic library, error = %s",local_18,local_40);
    printf("\n");
    local_374 = local_374 + 1;
  }
  return local_20;
}

Assistant:

symtype lh_load_sym (soHandle_t h, const char *symName) {
    symtype s;
    const char *from;
    char *to;
    const char *tripSym;
    char* err;
    char lcbuf[257];
    char ucbuf[257];
    char ocbuf[257];
    size_t symLen;
    int trip;

    s = OSQP_NULL;
    err = OSQP_NULL;

    /* search in this order:
     *  1. original
     *  2. lower_
     *  3. upper_
     *  4. original_
     *  5. lower
     *  6. upper
     */

    symLen = 0;
    for (trip = 1;  trip <= 6;  trip++) {
        switch (trip) {
        case 1:                             /* original */
            tripSym = symName;
            break;
        case 2:                             /* lower_ */
            for (from = symName, to = lcbuf;  *from;  from++, to++) {
                *to = tolower(*from);
            }
            symLen = from - symName;
            *to++ = '_';
            *to = '\0';
            tripSym = lcbuf;
            break;
        case 3:                             /* upper_ */
            for (from = symName, to = ucbuf;  *from;  from++, to++) {
                *to = toupper(*from);
            }
            *to++ = '_';
            *to = '\0';
            tripSym = ucbuf;
            break;
        case 4:                             /* original_ */
            c_strcpy(ocbuf, symName);
            ocbuf[symLen] = '_';
            ocbuf[symLen+1] = '\0';
            tripSym = ocbuf;
            break;
        case 5:                             /* lower */
            lcbuf[symLen] = '\0';
            tripSym = lcbuf;
            break;
        case 6:                             /* upper */
            ucbuf[symLen] = '\0';
            tripSym = ucbuf;
            break;
        default:
            tripSym = symName;
        } /* end switch */
#ifdef IS_WINDOWS
        s = GetProcAddress (h, tripSym);
        if (s) {
            return s;
        } else {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %d",
                    symName, (int)GetLastError());
            #endif
        }
#else
        s = dlsym (h, tripSym);
        err = dlerror();  /* we have only one chance; a successive call to dlerror() returns OSQP_NULL */
        if (err) {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %s",
                    symName, err);
            #endif
        } else {
            return s;
        }
#endif
    } /* end loop over symbol name variations */

    return OSQP_NULL;
}